

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O2

uint64_t helper_neon_qrshl_s64_aarch64(CPUARMState_conflict *env,uint64_t valop,uint64_t shiftop)

{
  uint64_t uVar1;
  byte bVar2;
  long lVar3;
  
  bVar2 = (byte)shiftop;
  if ((char)bVar2 < '@') {
    if ((char)bVar2 < -0x3f) {
      return 0;
    }
    if ((char)bVar2 < '\0') {
      lVar3 = (long)valop >> (~bVar2 & 0x3f);
      if (lVar3 == 0x7fffffffffffffff) {
        return 0x4000000000000000;
      }
      return lVar3 + 1 >> 1;
    }
    uVar1 = valop << (bVar2 & 0x3f);
    if ((long)uVar1 >> (bVar2 & 0x3f) == valop) {
      return uVar1;
    }
  }
  else if (valop == 0) {
    return 0;
  }
  (env->vfp).qc[0] = 1;
  uVar1 = 0x8000000000000000;
  if (-1 < (long)valop) {
    uVar1 = 0x7fffffffffffffff;
  }
  return uVar1;
}

Assistant:

uint64_t HELPER(neon_qrshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;

    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val = 0;
    } else if (shift < 0) {
        val >>= (-shift - 1);
        if (val == INT64_MAX) {
            /* In this case, it means that the rounding constant is 1,
             * and the addition would overflow. Return the actual
             * result directly.  */
            val = 0x4000000000000000ULL;
        } else {
            val++;
            val >>= 1;
        }
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}